

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O0

void __thiscall
BamTools::Internal::BamStandardIndex::OpenFile
          (BamStandardIndex *this,string *filename,OpenMode mode)

{
  long *plVar1;
  bool bVar2;
  IBamIODevice *pIVar3;
  undefined8 uVar4;
  undefined4 in_EDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  string message_1;
  string message;
  BamStandardIndex *in_stack_fffffffffffffeb8;
  BamStandardIndex *in_stack_fffffffffffffed0;
  allocator *paVar5;
  string *in_stack_fffffffffffffee8;
  undefined6 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffefe;
  undefined1 uVar6;
  allocator in_stack_fffffffffffffeff;
  BamException *in_stack_ffffffffffffff00;
  allocator local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 local_92;
  allocator local_91;
  string local_90 [55];
  allocator local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  undefined4 local_14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  CloseFile(in_stack_fffffffffffffed0);
  pIVar3 = BamDeviceFactory::CreateDevice(in_stack_fffffffffffffee8);
  *(IBamIODevice **)((long)&in_RDI[2].field_2 + 8) = pIVar3;
  if (*(long *)((long)&in_RDI[2].field_2 + 8) == 0) {
    paVar5 = &local_59;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_58,"could not open file: ",paVar5);
    std::operator+(&local_38,&local_58,local_10);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    local_92 = 1;
    uVar4 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"BamStandardIndex::OpenFile",&local_91);
    BamException::BamException
              (in_stack_ffffffffffffff00,
               (string *)
               CONCAT17(in_stack_fffffffffffffeff,
                        CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)),in_RDI);
    local_92 = 0;
    __cxa_throw(uVar4,&BamException::typeinfo,BamException::~BamException);
  }
  plVar1 = *(long **)((long)&in_RDI[2].field_2 + 8);
  (**(code **)(*plVar1 + 0x20))(plVar1,local_14);
  bVar2 = IsDeviceOpen(in_stack_fffffffffffffeb8);
  if (!bVar2) {
    paVar5 = &local_d9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_d8,"could not open file: ",paVar5);
    std::operator+(&local_b8,&local_d8,local_10);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    uVar6 = 1;
    uVar4 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff00,"BamStandardIndex::OpenFile",
               (allocator *)&stack0xfffffffffffffeff);
    BamException::BamException
              (in_stack_ffffffffffffff00,
               (string *)
               CONCAT17(in_stack_fffffffffffffeff,CONCAT16(uVar6,in_stack_fffffffffffffef8)),in_RDI)
    ;
    __cxa_throw(uVar4,&BamException::typeinfo,BamException::~BamException);
  }
  return;
}

Assistant:

void BamStandardIndex::OpenFile(const std::string& filename, IBamIODevice::OpenMode mode)
{

    // make sure any previous index file is closed
    CloseFile();

    m_resources.Device = BamDeviceFactory::CreateDevice(filename);
    if (m_resources.Device == 0) {
        const std::string message = std::string("could not open file: ") + filename;
        throw BamException("BamStandardIndex::OpenFile", message);
    }

    // attempt to open file
    m_resources.Device->Open(mode);
    if (!IsDeviceOpen()) {
        const std::string message = std::string("could not open file: ") + filename;
        throw BamException("BamStandardIndex::OpenFile", message);
    }
}